

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O3

void __thiscall thread_pool::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  ulong uVar2;
  pointer ptVar3;
  iterator __begin2;
  pointer ptVar4;
  
  LOCK();
  (this->terminate_)._M_base._M_i = true;
  UNLOCK();
  ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar3 != ptVar4) {
    uVar2 = 1;
    do {
      Semaphore::Signal(&this->thread_semaphore_);
      ptVar4 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      bVar1 = uVar2 < (ulong)((long)ptVar3 - (long)ptVar4 >> 3);
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (bVar1);
  }
  for (; ptVar4 != ptVar3; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&(this->queue_semaphore_).condition_);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->queue_).c);
  std::condition_variable::~condition_variable(&(this->thread_semaphore_).condition_);
  std::
  _Hashtable<std::thread::id,_std::pair<const_std::thread::id,_unsigned_int>,_std::allocator<std::pair<const_std::thread::id,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->thread_ids_)._M_h);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    terminate_ = true;
    for (std::uint32_t i = 0; i < threads_.size(); ++i) {
      thread_semaphore_.Signal();
    }
    for (auto& it : threads_) {
      it.join();
    }
  }